

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8CachePolicy.cpp
# Opt level: O2

GMM_STATUS __thiscall GmmLib::GmmGen8CachePolicy::InitCachePolicy(GmmGen8CachePolicy *this)

{
  anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1 *paVar1;
  byte *pbVar2;
  GMM_CACHE_POLICY_ELEMENT *pGVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  if (pGVar3 == (GMM_CACHE_POLICY_ELEMENT *)0x0) {
    return GMM_ERROR;
  }
  paVar1 = &pGVar3[1].field_1;
  *(byte *)paVar1 = *(byte *)paVar1 & 0xfe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[2].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[7].field_1.Value = pGVar3[7].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x14].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xc].field_1.Value = pGVar3[0xc].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xd].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 8;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x10].field_1.Value = pGVar3[0x10].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x10].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x12].field_1.Value =
       pGVar3[0x12].field_1.Value & 0xfffffffffffffffe |
       (ulong)(~(uint)(((this->super_GmmCachePolicyCommon).pGmmLibContext)->SkuTable).field_0 & 1);
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x12].field_1.Value = pGVar3[0x12].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x12].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x13].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x15].field_1.Value = pGVar3[0x15].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x15].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x16].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &((this->super_GmmCachePolicyCommon).pCachePolicy)->field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x17].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x18].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x19].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x1f].field_1.Value =
       pGVar3[0x1f].field_1.Value & 0xfffffffffffffffe |
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb == 0);
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x1f].field_1.Value =
       (pGVar3[0x1f].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x1f].field_1.Value = pGVar3[0x1f].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x1f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x20].field_1.Value =
       (pGVar3[0x20].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x20].field_1.Value =
       (pGVar3[0x20].field_1.Value & 0xfffffffffffffff7) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 8;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x20].field_1.Value = pGVar3[0x20].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x20].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x22].field_1.Value =
       (pGVar3[0x22].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x22].field_1.Value = pGVar3[0x22].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x22].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x23].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x24].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x25].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x27].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x29].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x2b].field_1.Value = pGVar3[0x2b].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x2c].field_1.Value =
       pGVar3[0x2c].field_1.Value & 0xfffffffffffffffe |
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb == 0);
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x2c].field_1.Value =
       (pGVar3[0x2c].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x2c].field_1.Value = pGVar3[0x2c].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x2f].field_1.Value =
       (pGVar3[0x2f].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x2f].field_1.Value = pGVar3[0x2f].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x2f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x30].field_1.Value =
       (pGVar3[0x30].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x30].field_1.Value = pGVar3[0x30].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x30].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x30;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x31].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x32].field_1.Value =
       (pGVar3[0x32].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x32].field_1.Value = pGVar3[0x32].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x32].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x33].field_1.Value = pGVar3[0x33].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x33].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x34].field_1.Value = pGVar3[0x34].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x34].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x35].field_1.Value =
       (pGVar3[0x35].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x35].field_1.Value = pGVar3[0x35].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x35].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x36].field_1.Value =
       (pGVar3[0x36].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x36].field_1.Value = pGVar3[0x36].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x36].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x37].field_1.Value =
       (pGVar3[0x37].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x37].field_1.Value = pGVar3[0x37].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x37].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x38].field_1.Value =
       (pGVar3[0x38].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x38].field_1.Value = pGVar3[0x38].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x38].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x41].field_1.Value =
       pGVar3[0x41].field_1.Value & 0xfffffffffffffffe |
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb == 0);
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x41].field_1.Value =
       (pGVar3[0x41].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x41].field_1.Value = pGVar3[0x41].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x41].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x42].field_1.Value = pGVar3[0x42].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x42].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x43].field_1.Value =
       (pGVar3[0x43].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x43].field_1.Value = pGVar3[0x43].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x43].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x44].field_1.Value = pGVar3[0x44].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x44].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x45].field_1.Value = pGVar3[0x45].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x45].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x46].field_1.Value = pGVar3[0x46].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x46].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x47].field_1.Value = pGVar3[0x47].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x47].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x48].field_1.Value =
       (pGVar3[0x48].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x48].field_1.Value = pGVar3[0x48].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x48].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x4b].field_1.Value =
       (pGVar3[0x4b].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x4b].field_1.Value = pGVar3[0x4b].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x4d].field_1.Value = pGVar3[0x4d].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x4e].field_1.Value = pGVar3[0x4e].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x4e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x50].field_1.Value =
       (pGVar3[0x50].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x50].field_1.Value = pGVar3[0x50].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x50].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x51].field_1.Value =
       (pGVar3[0x51].field_1.Value & 0xfffffffffffffffd) +
       (ulong)((((this->super_GmmCachePolicyCommon).pGmmLibContext)->GtSysInfo).EdramSizeInKb != 0)
       * 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x51].field_1.Value = pGVar3[0x51].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x51].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x3e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x54].field_1.Value = pGVar3[0x54].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x54].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x5f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x62].field_1.Value = pGVar3[0x62].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x62].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x68].field_1.Value = pGVar3[0x68].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x68].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x69].field_1.Value = pGVar3[0x69].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x69].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x6d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x73].field_1.Value = pGVar3[0x73].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x73].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x75].field_1.Value = pGVar3[0x75].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x75].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x76].field_1.Value = pGVar3[0x76].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x76].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x77].field_1.Value = pGVar3[0x77].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x77].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x78].field_1.Value = pGVar3[0x78].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x78].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x79].field_1.Value = pGVar3[0x79].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x79].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x7a].field_1.Value = pGVar3[0x7a].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x7b].field_1.Value = pGVar3[0x7b].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x7c].field_1.Value = pGVar3[0x7c].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x7d].field_1.Value = pGVar3[0x7d].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x7e].field_1.Value = pGVar3[0x7e].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x7f].field_1.Value = pGVar3[0x7f].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x7f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x80].field_1.Value = pGVar3[0x80].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x80].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x81].field_1.Value = pGVar3[0x81].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x81].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x82].field_1.Value = pGVar3[0x82].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x82].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x83].field_1.Value = pGVar3[0x83].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x83].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x84].field_1.Value = pGVar3[0x84].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x84].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x85].field_1.Value = pGVar3[0x85].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x85].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x86].field_1.Value = pGVar3[0x86].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x86].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x87].field_1.Value = pGVar3[0x87].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x87].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x89].field_1.Value = pGVar3[0x89].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x89].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x8b].field_1.Value = pGVar3[0x8b].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x8c].field_1.Value = pGVar3[0x8c].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8c].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x88].field_1.Value = pGVar3[0x88].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x88].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x8d].field_1.Value = pGVar3[0x8d].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8d].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x8e].field_1.Value = pGVar3[0x8e].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8e].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x8f].field_1.Value = pGVar3[0x8f].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x8f].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x90].field_1.Value = pGVar3[0x90].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x90].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x92].field_1.Value = pGVar3[0x92].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x92].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x93].field_1.Value = pGVar3[0x93].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x93].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x94].field_1.Value = pGVar3[0x94].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x94].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x95].field_1.Value = pGVar3[0x95].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x95].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x96].field_1.Value = pGVar3[0x96].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x96].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x99].field_1.Value = pGVar3[0x99].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x99].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x9a].field_1.Value = pGVar3[0x9a].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0x9b].field_1.Value = pGVar3[0x9b].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x9b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xa3].field_1.Value = pGVar3[0xa3].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xa3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xdc].field_1.Value = pGVar3[0xdc].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdc].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xdf].field_1.Value = pGVar3[0xdf].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xdf].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe0].field_1.Value = pGVar3[0xe0].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe1].field_1.Value = pGVar3[0xe1].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe1].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe3].field_1.Value = pGVar3[0xe3].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe4].field_1.Value = pGVar3[0xe4].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe4].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe5].field_1.Value = pGVar3[0xe5].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe5].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe6].field_1.Value = pGVar3[0xe6].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe6].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe7].field_1.Value = pGVar3[0xe7].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe7].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe8].field_1.Value = pGVar3[0xe8].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe8].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xe9].field_1.Value = pGVar3[0xe9].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xe9].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xea].field_1.Value = pGVar3[0xea].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xea].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 4;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xeb].field_1.Value = pGVar3[0xeb].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xeb].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value | 1;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value | 2;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xec].field_1.Value = pGVar3[0xec].field_1.Value & 0xffffffffffffffcf | 0x10;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xec].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf0].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xf3].field_1.Value =
       pGVar3[0xf3].field_1.Value & 0xfffffffffffffffe |
       (ulong)(*(uint *)&(((this->super_GmmCachePolicyCommon).pGmmLibContext)->SkuTable).field_1 >>
               0x16 & 1);
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
  pGVar3[0xf3].field_1.Value =
       pGVar3[0xf3].field_1.Value & 0xffffffffffffffcf |
       (ulong)(*(uint *)&(((this->super_GmmCachePolicyCommon).pGmmLibContext)->SkuTable).field_1 >>
               0x12 & 0x10);
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0xf3].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11a].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffe;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffd;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffffb;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffff7;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffcf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffffbf;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffffc7f;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffe3ff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffffdfff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffcffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffff3fff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffffbffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffffe7ffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffff1fffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffeffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffffdffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffffe3ffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value | 0x20000000;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffffffff3fffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffffcffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffffff3ffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfffcffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xfff3ffffffffffff;
  paVar1 = &(this->super_GmmCachePolicyCommon).pCachePolicy[0x11b].field_1;
  paVar1->Value = paVar1->Value & 0xffefffffffffffff;
  lVar5 = 0;
  do {
    if (lVar5 == 0x2cb0) {
      return GMM_SUCCESS;
    }
    pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    uVar4 = *(ulong *)((long)&pGVar3->field_1 + lVar5);
    if ((~(uint)uVar4 & 7) == 0) {
      pbVar2 = (byte *)((long)&pGVar3->MemoryObjectOverride + lVar5);
      *pbVar2 = *pbVar2 | 0x18;
    }
    else if ((~(uint)uVar4 & 3) == 0) {
      uVar6 = *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) & 0xffffffe7 | 0x10;
LAB_001130ac:
      *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) = uVar6;
    }
    else if ((uVar4 & 2) == 0) {
      if ((uVar4 & 1) != 0) {
        uVar6 = *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) & 0xffffffe7 | 8;
        goto LAB_001130ac;
      }
    }
    else {
      pbVar2 = (byte *)((long)&pGVar3->MemoryObjectOverride + lVar5);
      *pbVar2 = *pbVar2 & 0xe7;
    }
    pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) =
         *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) & 0xfffffffc |
         *(uint *)((long)&pGVar3->field_1 + lVar5) >> 4 & 3;
    pGVar3 = (this->super_GmmCachePolicyCommon).pCachePolicy;
    uVar4 = *(ulong *)((long)&pGVar3->field_1 + lVar5);
    if ((uVar4 & 8) == 0) {
      if ((uVar4 & 3) == 0) {
        uVar6 = *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) & 0xffffff9f | 0x20;
        goto LAB_00113120;
      }
      pbVar2 = (byte *)((long)&pGVar3->MemoryObjectOverride + lVar5);
      *pbVar2 = *pbVar2 | 0x60;
    }
    else {
      uVar6 = *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) & 0xffffff9f | 0x40;
LAB_00113120:
      *(uint *)((long)&pGVar3->MemoryObjectOverride + lVar5) = uVar6;
    }
    *(undefined4 *)((long)&((this->super_GmmCachePolicyCommon).pCachePolicy)->PTE + lVar5) = 0;
    *(undefined4 *)((long)&((this->super_GmmCachePolicyCommon).pCachePolicy)->PTE + lVar5 + 4) = 0;
    *(undefined4 *)((long)&((this->super_GmmCachePolicyCommon).pCachePolicy)->Override + lVar5) =
         0xffffffff;
    lVar5 = lVar5 + 0x28;
  } while( true );
}

Assistant:

GMM_STATUS GmmLib::GmmGen8CachePolicy::InitCachePolicy()
{

    __GMM_ASSERTPTR(pCachePolicy, GMM_ERROR);

#define DEFINE_CACHE_ELEMENT(usage, llc, ellc, l3, wt, age) DEFINE_CP_ELEMENT(usage, llc, ellc, l3, wt, age, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0)
#include "GmmGen8CachePolicy.h"

    {
// Gen8 Memory Object Definitions
#define MO_ELLC 0x0
#define MO_LLC 0x1
#define MO_LLC_ELLC 0x2
#define MO_L3_LLC_ELLC 0x3

#define MO_USE_PTE 0x0
#define MO_UC 0x1
#define MO_WT 0x2
#define MO_WB 0x3

        // Define index of cache element
        uint32_t Usage = 0;

        // Process Cache Policy and fill in look up table
        for(; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
        {
            bool     CachePolicyError = false;
            uint64_t PTEValue         = 0;

            if(pCachePolicy[Usage].LLC && pCachePolicy[Usage].ELLC && pCachePolicy[Usage].L3)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_L3_LLC_ELLC;
            else if(pCachePolicy[Usage].LLC && pCachePolicy[Usage].ELLC)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_LLC_ELLC;
            else if(pCachePolicy[Usage].ELLC)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_ELLC;
            else if(pCachePolicy[Usage].LLC)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.TargetCache = MO_LLC;

            pCachePolicy[Usage].MemoryObjectOverride.Gen8.Age = pCachePolicy[Usage].AGE;

            if(pCachePolicy[Usage].WT)
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.CacheControl = MO_WT;
            // L3 is not included because WT vs UC vs WB only effects uncore
            else if(!(pCachePolicy[Usage].LLC || pCachePolicy[Usage].ELLC))
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.CacheControl = MO_UC;

            else
                pCachePolicy[Usage].MemoryObjectOverride.Gen8.CacheControl = MO_WB;


            if(!GetUsagePTEValue(pCachePolicy[Usage], Usage, &PTEValue))
            {
                CachePolicyError = true;
            }
            // On error, the PTE value is set to a UC PAT entry
            pCachePolicy[Usage].PTE.DwordValue     = PTEValue & 0xFFFFFFFF;
            pCachePolicy[Usage].PTE.HighDwordValue = 0;
	    pCachePolicy[Usage].Override       = ALWAYS_OVERRIDE;

            if(CachePolicyError)
            {
                GMM_ASSERTDPF("Cache Policy Init Error: Invalid Cache Programming - Element %d", Usage);
            }
        }
    }

    return GMM_SUCCESS;
}